

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_color_hsva_f(float *out_h,float *out_s,float *out_v,float *out_a,nk_color in)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = (float)((uint)in & 0xff) * 0.003921569;
  fVar4 = (float)((uint)in >> 8 & 0xff) * 0.003921569;
  fVar6 = (float)((uint)in >> 0x10 & 0xff) * 0.003921569;
  fVar5 = (float)(-(uint)(fVar4 < fVar6) & 0xbf800000);
  fVar2 = fVar6;
  if (fVar6 <= fVar4) {
    fVar2 = fVar4;
    fVar4 = fVar6;
  }
  fVar6 = fVar1;
  fVar3 = fVar2;
  if (fVar1 < fVar2) {
    fVar6 = fVar2;
    fVar3 = fVar1;
  }
  fVar7 = fVar3;
  if (fVar4 <= fVar3) {
    fVar7 = fVar4;
  }
  fVar4 = (float)(~-(uint)(fVar1 < fVar2) & (uint)fVar5 |
                 (uint)(-0.33333334 - fVar5) & -(uint)(fVar1 < fVar2)) +
          (fVar3 - fVar4) / ((fVar6 - fVar7) * 6.0 + 1e-20);
  fVar2 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar2 = fVar4;
  }
  *out_h = fVar2;
  *out_s = (fVar6 - fVar7) / (fVar6 + 1e-20);
  *out_v = fVar6;
  *out_a = (float)((uint)in >> 0x18) * 0.003921569;
  return;
}

Assistant:

NK_API void
nk_color_hsva_f(float *out_h, float *out_s,
float *out_v, float *out_a, struct nk_color in)
{
struct nk_colorf col;
nk_color_f(&col.r,&col.g,&col.b,&col.a, in);
nk_colorf_hsva_f(out_h, out_s, out_v, out_a, col);
}